

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffinttyp(char *cval,int *dtype,int *negative,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int *in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  char *p;
  int len;
  int ii;
  char *local_38;
  int local_2c;
  int local_4;
  
  if (*in_RCX < 1) {
    *in_RSI = 0;
    *in_RDX = 0;
    if (*in_RDI == '+') {
      local_38 = in_RDI + 1;
    }
    else {
      local_38 = in_RDI;
      if (*in_RDI == '-') {
        local_38 = in_RDI + 1;
        *in_RDX = 1;
      }
    }
    if (*local_38 == '0') {
      for (; *local_38 == '0'; local_38 = local_38 + 1) {
      }
      if (*local_38 == '\0') {
        *in_RSI = 0xc;
        return *in_RCX;
      }
    }
    sVar2 = strlen(local_38);
    iVar1 = (int)sVar2;
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)local_38[local_2c]] & 0x800) == 0) {
        *in_RCX = 0x193;
        return *in_RCX;
      }
    }
    if (iVar1 == 0) {
      *in_RCX = 0xcc;
    }
    else if (iVar1 < 3) {
      *in_RSI = 0xc;
    }
    else if (iVar1 == 4) {
      *in_RSI = 0x15;
    }
    else if ((iVar1 < 6) || (9 < iVar1)) {
      if ((iVar1 < 0xb) || (0x12 < iVar1)) {
        if (iVar1 < 0x15) {
          if (*in_RDX == 0) {
            if (iVar1 == 3) {
              iVar1 = strcmp(local_38,"127");
              if (iVar1 < 1) {
                *in_RSI = 0xc;
              }
              else {
                iVar1 = strcmp(local_38,"255");
                if (iVar1 < 1) {
                  *in_RSI = 0xb;
                }
                else {
                  *in_RSI = 0x15;
                }
              }
            }
            else if (iVar1 == 5) {
              iVar1 = strcmp(local_38,"32767");
              if (iVar1 < 1) {
                *in_RSI = 0x15;
              }
              else {
                iVar1 = strcmp(local_38,"65535");
                if (iVar1 < 1) {
                  *in_RSI = 0x14;
                }
                else {
                  *in_RSI = 0x1f;
                }
              }
            }
            else if (iVar1 == 10) {
              iVar1 = strcmp(local_38,"2147483647");
              if (iVar1 < 1) {
                *in_RSI = 0x1f;
              }
              else {
                iVar1 = strcmp(local_38,"4294967295");
                if (iVar1 < 1) {
                  *in_RSI = 0x1e;
                }
                else {
                  *in_RSI = 0x51;
                }
              }
            }
            else if (iVar1 == 0x13) {
              iVar1 = strcmp(local_38,"9223372036854775807");
              if (iVar1 < 1) {
                *in_RSI = 0x51;
              }
              else {
                *in_RSI = 0x50;
              }
            }
            else if (iVar1 == 0x14) {
              iVar1 = strcmp(local_38,"18446744073709551615");
              if (iVar1 < 1) {
                *in_RSI = 0x50;
              }
              else {
                *in_RCX = 0x193;
              }
            }
          }
          else if (iVar1 == 3) {
            iVar1 = strcmp(local_38,"128");
            if (iVar1 < 1) {
              *in_RSI = 0xc;
            }
            else {
              *in_RSI = 0x15;
            }
          }
          else if (iVar1 == 5) {
            iVar1 = strcmp(local_38,"32768");
            if (iVar1 < 1) {
              *in_RSI = 0x15;
            }
            else {
              *in_RSI = 0x1f;
            }
          }
          else if (iVar1 == 10) {
            iVar1 = strcmp(local_38,"2147483648");
            if (iVar1 < 1) {
              *in_RSI = 0x1f;
            }
            else {
              *in_RSI = 0x51;
            }
          }
          else if (iVar1 == 0x13) {
            iVar1 = strcmp(local_38,"9223372036854775808");
            if (iVar1 < 1) {
              *in_RSI = 0x51;
            }
            else {
              *in_RCX = 0x193;
            }
          }
        }
        else {
          *in_RCX = 0x193;
        }
      }
      else {
        *in_RSI = 0x51;
      }
    }
    else {
      *in_RSI = 0x1f;
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffinttyp(char *cval,  /* I - formatted string representation of the integer */
           int *dtype, /* O - datatype code: TBYTE, TSHORT, TUSHORT, etc */
           int *negative, /* O - is cval negative? */
           int *status)  /* IO - error status */
/*
  determine implicit datatype of input integer string.
  This assumes that the string conforms to the FITS standard
  for integer keyword value, so may not detect all invalid formats.
*/
{
    int ii, len;
    char *p;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *dtype = 0;  /* initialize to NULL */
    *negative = 0;
    p = cval;

    if (*p == '+') {
        p++;   /* ignore leading + sign */
    } else if (*p == '-') {
        p++;
	*negative = 1;   /* this is a negative number */
    }

    if (*p == '0') {
        while (*p == '0') p++;  /* skip leading zeros */

        if (*p == 0) {  /* the value is a string of 1 or more zeros */
           *dtype  = TSBYTE;
	   return(*status);
        }
    }

    len = strlen(p);
    for (ii = 0; ii < len; ii++)  {
        if (!isdigit(*(p+ii))) {
	    *status = BAD_INTKEY;
	    return(*status);
	}
    }

    /* check for unambiguous cases, based on length of the string */
    if (len == 0) {
        *status = VALUE_UNDEFINED;
    } else if (len < 3) {
        *dtype = TSBYTE;
    } else if (len == 4) {
	*dtype = TSHORT;
    } else if (len > 5 && len < 10) {
        *dtype = TINT;
    } else if (len > 10 && len < 19) {
        *dtype = TLONGLONG;
    } else if (len > 20) {
	*status = BAD_INTKEY;
    } else {
    
      if (!(*negative)) {  /* positive integers */
	if (len == 3) {
	    if (strcmp(p,"127") <= 0 ) {
	        *dtype = TSBYTE;
	    } else if (strcmp(p,"255") <= 0 ) {
	        *dtype = TBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32767") <= 0 ) {
	        *dtype = TSHORT;
 	    } else if (strcmp(p,"65535") <= 0 ) {
	        *dtype = TUSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483647") <= 0 ) {
	        *dtype = TINT;
	    } else if (strcmp(p,"4294967295") <= 0 ) {
	        *dtype = TUINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775807") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*dtype = TULONGLONG;
	    }
	} else if (len == 20) {
	    if (strcmp(p,"18446744073709551615") <= 0 ) {
	        *dtype = TULONGLONG;
	    } else {
	        *status = BAD_INTKEY;
	    }
	}

      } else {  /* negative integers */
	if (len == 3) {
	    if (strcmp(p,"128") <= 0 ) {
	        *dtype = TSBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32768") <= 0 ) {
	        *dtype = TSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483648") <= 0 ) {
	        *dtype = TINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775808") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*status = BAD_INTKEY;
	    }
	}
      }
    }

    return(*status);
}